

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O0

string * __thiscall
cmNinjaTargetGenerator::ComputeFlagsForObject
          (string *__return_storage_ptr__,cmNinjaTargetGenerator *this,cmSourceFile *source,
          string *language)

{
  cmLocalNinjaGenerator *pcVar1;
  string *this_00;
  bool bVar2;
  char *pcVar3;
  allocator local_61;
  string local_60;
  undefined1 local_29;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  string *language_local;
  cmSourceFile *source_local;
  cmNinjaTargetGenerator *this_local;
  string *flags;
  
  local_29 = 0;
  local_28 = language;
  language_local = (string *)source;
  source_local = (cmSourceFile *)this;
  this_local = (cmNinjaTargetGenerator *)__return_storage_ptr__;
  cmCommonTargetGenerator::GetFlags
            (__return_storage_ptr__,&this->super_cmCommonTargetGenerator,language);
  bVar2 = std::operator==(local_28,"Fortran");
  if (bVar2) {
    cmCommonTargetGenerator::AppendFortranFormatFlags
              (&this->super_cmCommonTargetGenerator,__return_storage_ptr__,
               (cmSourceFile *)language_local);
  }
  this_00 = language_local;
  pcVar1 = this->LocalGenerator;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_60,"COMPILE_FLAGS",&local_61);
  pcVar3 = cmSourceFile::GetProperty((cmSourceFile *)this_00,&local_60);
  (*(pcVar1->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[6])
            (pcVar1,__return_storage_ptr__,pcVar3);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  return __return_storage_ptr__;
}

Assistant:

std::string
cmNinjaTargetGenerator::ComputeFlagsForObject(cmSourceFile const* source,
                                              const std::string& language)
{
  std::string flags = this->GetFlags(language);

  // Add Fortran format flags.
  if(language == "Fortran")
    {
    this->AppendFortranFormatFlags(flags, *source);
    }

  // Add source file specific flags.
  this->LocalGenerator->AppendFlags(flags,
    source->GetProperty("COMPILE_FLAGS"));

  return flags;
}